

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O0

Vec_Int_t *
Saig_ManProcessCex(Aig_Man_t *p,int iFirstFlopPi,Abc_Cex_t *pCex,Vec_Ptr_t *vSimInfo,int fVerbose)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *vRes_00;
  int local_50;
  int Value;
  int f;
  int i;
  Vec_Int_t *vResInv;
  Vec_Int_t *vRes;
  Aig_Obj_t *pObj;
  int fVerbose_local;
  Vec_Ptr_t *vSimInfo_local;
  Abc_Cex_t *pCex_local;
  int iFirstFlopPi_local;
  Aig_Man_t *p_local;
  
  pvVar2 = Vec_PtrEntry(vSimInfo,1);
  pvVar3 = Vec_PtrEntry(vSimInfo,0);
  iVar1 = Abc_BitWordNum((pCex->iFrame + 1) * 2);
  if ((long)pvVar2 - (long)pvVar3 >> 2 < (long)iVar1) {
    __assert_fail("(unsigned *)Vec_PtrEntry(vSimInfo,1) - (unsigned *)Vec_PtrEntry(vSimInfo,0) >= Abc_BitWordNum(2*(pCex->iFrame+1))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                  ,0x18a,
                  "Vec_Int_t *Saig_ManProcessCex(Aig_Man_t *, int, Abc_Cex_t *, Vec_Ptr_t *, int)");
  }
  iVar1 = Saig_ManSimDataInit2(p,pCex,vSimInfo);
  if (iVar1 != 1) {
    __assert_fail("Value == SAIG_ONE_NEW",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                  ,0x18d,
                  "Vec_Int_t *Saig_ManProcessCex(Aig_Man_t *, int, Abc_Cex_t *, Vec_Ptr_t *, int)");
  }
  for (Value = 0; iVar1 = Saig_ManRegNum(p), Value < iVar1; Value = Value + 1) {
    p_00 = p->vCis;
    iVar1 = Saig_ManPiNum(p);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,Value + iVar1);
    Saig_ManSetAndDriveImplications_rec(p,pAVar4,0,pCex->iFrame,vSimInfo);
  }
  for (local_50 = pCex->iFrame; -1 < local_50; local_50 = local_50 + -1) {
    pAVar4 = Aig_ManConst1(p);
    Saig_ManSetAndDriveImplications_rec(p,pAVar4,local_50,pCex->iFrame,vSimInfo);
    for (Value = 0; Value < iFirstFlopPi; Value = Value + 1) {
      pAVar4 = Aig_ManCi(p,Value);
      Saig_ManSetAndDriveImplications_rec(p,pAVar4,local_50,pCex->iFrame,vSimInfo);
    }
  }
  pAVar4 = Aig_ManCo(p,pCex->iPo);
  Saig_ManExplorePaths_rec(p,pAVar4,pCex->iFrame,pCex->iFrame,vSimInfo);
  p_01 = Vec_IntAlloc(1000);
  vRes_00 = Vec_IntAlloc(1000);
  Value = iFirstFlopPi;
  do {
    iVar1 = Saig_ManPiNum(p);
    if (iVar1 <= Value) {
      iVar1 = Saig_ManSimDataInit(p,pCex,vSimInfo,vRes_00);
      if (iVar1 == 2) {
        Vec_IntFree(vRes_00);
        return p_01;
      }
      __assert_fail("Value == SAIG_ONE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                    ,0x1ab,
                    "Vec_Int_t *Saig_ManProcessCex(Aig_Man_t *, int, Abc_Cex_t *, Vec_Ptr_t *, int)"
                   );
    }
    for (local_50 = pCex->iFrame; -1 < local_50; local_50 = local_50 + -1) {
      pAVar4 = Aig_ManCi(p,Value);
      iVar1 = Saig_ManSimInfo2Get(vSimInfo,pAVar4,local_50);
      iVar1 = Saig_ManSimInfo2IsOld(iVar1);
      if (iVar1 != 0) break;
    }
    if (local_50 < 0) {
      Vec_IntPush(vRes_00,Value);
    }
    else {
      Vec_IntPush(p_01,Value);
    }
    Value = Value + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Saig_ManProcessCex( Aig_Man_t * p, int iFirstFlopPi, Abc_Cex_t * pCex, Vec_Ptr_t * vSimInfo, int fVerbose )
{
    Aig_Obj_t * pObj;
    Vec_Int_t * vRes, * vResInv;
    int i, f, Value;
//    assert( Aig_ManRegNum(p) > 0 );
    assert( (unsigned *)Vec_PtrEntry(vSimInfo,1) - (unsigned *)Vec_PtrEntry(vSimInfo,0) >= Abc_BitWordNum(2*(pCex->iFrame+1)) );
    // start simulation data
    Value = Saig_ManSimDataInit2( p, pCex, vSimInfo );
    assert( Value == SAIG_ONE_NEW );
    // derive implications of constants and primary inputs
    Saig_ManForEachLo( p, pObj, i )
        Saig_ManSetAndDriveImplications_rec( p, pObj, 0, pCex->iFrame, vSimInfo );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        Saig_ManSetAndDriveImplications_rec( p, Aig_ManConst1(p), f, pCex->iFrame, vSimInfo );
        for ( i = 0; i < iFirstFlopPi; i++ )
            Saig_ManSetAndDriveImplications_rec( p, Aig_ManCi(p, i), f, pCex->iFrame, vSimInfo );
    }
    // recursively compute justification
    Saig_ManExplorePaths_rec( p, Aig_ManCo(p, pCex->iPo), pCex->iFrame, pCex->iFrame, vSimInfo );
    // select the result
    vRes = Vec_IntAlloc( 1000 );
    vResInv = Vec_IntAlloc( 1000 );
    for ( i = iFirstFlopPi; i < Saig_ManPiNum(p); i++ )
    {
        for ( f = pCex->iFrame; f >= 0; f-- )
        {
            Value = Saig_ManSimInfo2Get( vSimInfo, Aig_ManCi(p, i), f );
            if ( Saig_ManSimInfo2IsOld( Value ) )
                break;
        }
        if ( f >= 0 )
            Vec_IntPush( vRes, i );
        else
            Vec_IntPush( vResInv, i );
    }
    // resimulate to make sure it is valid
    Value = Saig_ManSimDataInit( p, pCex, vSimInfo, vResInv );
    assert( Value == SAIG_ONE );
    Vec_IntFree( vResInv );
    return vRes;
}